

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QShaderDescription::InOutVariable>::moveAppend
          (QGenericArrayOps<QShaderDescription::InOutVariable> *this,InOutVariable *b,
          InOutVariable *e)

{
  InOutVariable *this_00;
  ulong in_RDX;
  ulong in_RSI;
  InOutVariable *in_RDI;
  InOutVariable *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QShaderDescription::InOutVariable>::begin
                        ((QArrayDataPointer<QShaderDescription::InOutVariable> *)0x6eef47);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QShaderDescription::InOutVariable::InOutVariable(this_00,in_RDI);
      local_10 = local_10 + 0x68;
      (in_RDI->name).d.size = (in_RDI->name).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }